

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

size_t __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
::prepare_insert(raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
                 *this,size_t hashval)

{
  size_t sVar1;
  unsigned_long uVar2;
  ctrl_t *pcVar3;
  raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
  *this_00;
  FindInfo FVar4;
  
  this_00 = (raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
             *)this->ctrl_;
  if (this_00 ==
      (raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
       *)0x0) {
    rehash_and_grow_if_necessary(this);
    this_00 = (raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
               *)this->ctrl_;
  }
  FVar4 = find_first_non_full(this_00,this->capacity_);
  sVar1 = FVar4.offset;
  pcVar3 = this->ctrl_;
  uVar2 = (this->settings_).
          super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
          .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
  if (uVar2 == 0) {
    if (pcVar3[sVar1] == -2) {
      uVar2 = 0;
    }
    else {
      rehash_and_grow_if_necessary(this);
      FVar4 = find_first_non_full((raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
                                   *)this->ctrl_,this->capacity_);
      sVar1 = FVar4.offset;
      pcVar3 = this->ctrl_;
      uVar2 = (this->settings_).
              super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
              .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    }
  }
  this->size_ = this->size_ + 1;
  (this->settings_).
  super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar2 - (pcVar3[sVar1] == -0x80);
  return sVar1;
}

Assistant:

size_t prepare_insert(size_t hashval) PHMAP_ATTRIBUTE_NOINLINE {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                rehash_and_grow_if_necessary();
        }
        FindInfo target = find_first_non_full(hashval);
        if (PHMAP_PREDICT_FALSE(growth_left() == 0 &&
                               !IsDeleted(ctrl_[target.offset]))) {
            rehash_and_grow_if_necessary();
            target = find_first_non_full(hashval);
        }
        ++size_;
        growth_left() -= IsEmpty(ctrl_[target.offset]);
        // set_ctrl(target.offset, H2(hashval));
        infoz_.RecordInsert(hashval, target.probe_length);
        return target.offset;
    }